

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

bool __thiscall
google::protobuf::internal::KeyMapBase<bool>::revalidate_if_necessary
          (KeyMapBase<bool> *this,map_index_t *bucket_index,KeyNode *node,TreeIterator *it)

{
  TableEntryPtr TVar1;
  uint uVar2;
  TableEntryPtr TVar3;
  NodeBase *pNVar4;
  bool bVar5;
  NodeAndBucket NVar6;
  
  uVar2 = (this->super_UntypedMapBase).num_buckets_ - 1 & *bucket_index;
  *bucket_index = uVar2;
  TVar1 = (this->super_UntypedMapBase).table_[uVar2];
  TVar3 = NodeToTableEntry(&node->super_NodeBase);
  bVar5 = true;
  if (TVar1 != TVar3) {
    TVar1 = (this->super_UntypedMapBase).table_[*bucket_index];
    if ((TVar1 & 1) == 0 && TVar1 != 0) {
      pNVar4 = TableEntryToNode(TVar1);
      do {
        pNVar4 = pNVar4->next;
        if (pNVar4 == &node->super_NodeBase) break;
      } while (pNVar4 != (NodeBase *)0x0);
      if (pNVar4 != (NodeBase *)0x0) {
        return true;
      }
    }
    NVar6 = FindHelper(this,(ViewType)(*(byte *)&node[1].super_NodeBase.next & 1),it);
    *bucket_index = NVar6.bucket;
    bVar5 = ((this->super_UntypedMapBase).table_[NVar6.bucket] & 1) == 0;
  }
  return bVar5;
}

Assistant:

bool revalidate_if_necessary(map_index_t& bucket_index, KeyNode* node,
                               TreeIterator* it) const {
    // Force bucket_index to be in range.
    bucket_index &= (num_buckets_ - 1);
    // Common case: the bucket we think is relevant points to `node`.
    if (table_[bucket_index] == NodeToTableEntry(node)) return true;
    // Less common: the bucket is a linked list with node_ somewhere in it,
    // but not at the head.
    if (TableEntryIsNonEmptyList(bucket_index)) {
      auto* l = TableEntryToNode(table_[bucket_index]);
      while ((l = l->next) != nullptr) {
        if (l == node) {
          return true;
        }
      }
    }
    // Well, bucket_index_ still might be correct, but probably
    // not.  Revalidate just to be sure.  This case is rare enough that we
    // don't worry about potential optimizations, such as having a custom
    // find-like method that compares Node* instead of the key.
    auto res = FindHelper(node->key(), it);
    bucket_index = res.bucket;
    return TableEntryIsList(bucket_index);
  }